

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-mongo.c
# Opt level: O2

void buffer_reserve(buffer *b,int sz)

{
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  int iVar4;
  
  iVar1 = b->size;
  iVar4 = sz + iVar1;
  iVar2 = b->cap;
  if (iVar2 < iVar4) {
    do {
      iVar2 = iVar2 * 2;
    } while (iVar2 <= iVar4);
    b->cap = iVar2;
    if (b->ptr == b->buffer) {
      puVar3 = (uint8_t *)malloc((long)iVar2);
      b->ptr = puVar3;
      memcpy(puVar3,b->buffer,(long)iVar1);
      return;
    }
    puVar3 = (uint8_t *)realloc(b->ptr,(long)iVar2);
    b->ptr = puVar3;
  }
  return;
}

Assistant:

static inline void
buffer_reserve(struct buffer *b, int sz) {
	if (b->size + sz <= b->cap)
		return;
	do {
		b->cap *= 2;
	} while (b->cap <= b->size + sz);

	if (b->ptr == b->buffer) {
		b->ptr = skynet_malloc(b->cap);
		memcpy(b->ptr, b->buffer, b->size);
	} else {
		b->ptr = skynet_realloc(b->ptr, b->cap);
	}
}